

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

pair<int_*,_bool>
HighsHashTree<int,_int>::insert_into_leaf<2>
          (NodePtr *insertNode,InnerLeaf<2> *leaf,uint64_t hash,int hashPos,
          HighsHashTableEntry<int,_int> *entry)

{
  int iVar1;
  InnerLeaf<3> *this;
  InnerLeaf<3> *ptr;
  undefined4 in_ECX;
  InnerLeaf<2> *in_RDX;
  void *in_RSI;
  uintptr_t *in_RDI;
  HighsHashTableEntry<int,_int> *in_R8;
  pair<int_*,_bool> pVar2;
  InnerLeaf<3> *newLeaf;
  ValueType *existingEntry;
  bool *in_stack_ffffffffffffff38;
  int **in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  int hashPos_00;
  void *fullHash;
  int iVar3;
  NodePtr local_78 [3];
  InnerLeaf<3> *local_60;
  Entry *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  InnerLeaf<2> *in_stack_ffffffffffffffc0;
  int *local_10;
  undefined1 local_8;
  
  hashPos_00 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  iVar3 = *(int *)((long)in_RSI + 8);
  iVar1 = InnerLeaf<2>::capacity();
  if (iVar3 == iVar1) {
    fullHash = in_RSI;
    HighsHashTableEntry<int,_int>::key(in_R8);
    this = (InnerLeaf<3> *)
           InnerLeaf<2>::find_entry
                     (in_RDX,(uint64_t)fullHash,hashPos_00,(int *)in_stack_ffffffffffffff40);
    if (this == (InnerLeaf<3> *)0x0) {
      ptr = (InnerLeaf<3> *)operator_new(0x278);
      InnerLeaf<3>::InnerLeaf<2>((InnerLeaf<3> *)CONCAT44(iVar3,in_ECX),in_RDX);
      local_60 = ptr;
      NodePtr::NodePtr(local_78,ptr);
      *in_RDI = local_78[0].ptrAndType;
      if (in_RSI != (void *)0x0) {
        operator_delete(in_RSI);
      }
      pVar2 = InnerLeaf<3>::insert_entry
                        (this,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
      local_8 = pVar2.second;
    }
    else {
      pVar2 = std::make_pair<int*&,bool>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_8 = pVar2.second;
    }
  }
  else {
    pVar2 = InnerLeaf<2>::insert_entry
                      (in_stack_ffffffffffffffc0,
                       CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    local_8 = pVar2.second;
  }
  local_10 = pVar2.first;
  pVar2.second = (bool)local_8;
  pVar2.first = local_10;
  return pVar2;
}

Assistant:

static std::pair<ValueType*, bool> insert_into_leaf(
      NodePtr* insertNode, InnerLeaf<SizeClass>* leaf, uint64_t hash,
      int hashPos, HighsHashTableEntry<K, V>& entry) {
    if (leaf->size == InnerLeaf<SizeClass>::capacity()) {
      auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
      if (existingEntry) return std::make_pair(existingEntry, false);

      InnerLeaf<SizeClass + 1>* newLeaf =
          new InnerLeaf<SizeClass + 1>(std::move(*leaf));
      *insertNode = newLeaf;
      delete leaf;
      return newLeaf->insert_entry(hash, hashPos, entry);
    }

    return leaf->insert_entry(hash, hashPos, entry);
  }